

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::ResourceBundle::getStringEx
          (UnicodeString *__return_storage_ptr__,ResourceBundle *this,char *key,UErrorCode *status)

{
  int32_t len;
  ConstChar16Ptr local_30 [3];
  int32_t local_14;
  
  local_14 = 0;
  local_30[0].p_ = ures_getStringByKey_63(this->fResource,key,&local_14,status);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_30,local_14);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceBundle::getStringEx(const char* key, UErrorCode& status) const {
    int32_t len = 0;
    const UChar* r = ures_getStringByKey(fResource, key, &len, &status);
    return UnicodeString(TRUE, r, len);
}